

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-list.c
# Opt level: O2

wchar_t monster_list_standard_compare(void *a,void *b)

{
  int iVar1;
  int iVar2;
  wchar_t wVar3;
  
  if (*b == 0 || *a == 0) {
    wVar3 = L'\x01';
  }
  else {
    iVar1 = *(int *)(*b + 0x80);
    iVar2 = *(int *)(*a + 0x80);
    if (iVar2 <= iVar1) {
      return (wchar_t)(iVar2 < iVar1);
    }
    wVar3 = L'\xffffffff';
  }
  return wVar3;
}

Assistant:

int monster_list_standard_compare(const void *a, const void *b)
{
	const struct monster_race *ar = ((monster_list_entry_t *)a)->race;
	const struct monster_race *br = ((monster_list_entry_t *)b)->race;

	/* If this happens, something might be wrong in the collect function. */
	if (ar == NULL || br == NULL)
		return 1;

	/* Check depth first.*/
	if (ar->level > br->level)
		return -1;

	if (ar->level < br->level)
		return 1;

	return 0;
}